

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FboTestCase::iterate(FboTestCase *this)

{
  ContextWrapper *this_00;
  RenderContext *context_00;
  TestLog *log;
  int width;
  int height;
  int iVar1;
  deUint32 dVar2;
  ChannelOrder CVar3;
  ChannelType CVar4;
  undefined4 extraout_var;
  Error *this_01;
  char *description;
  Surface result;
  Surface reference;
  Random rnd;
  ReferenceContextBuffers buffers;
  code *local_62b0;
  deUint32 local_62a8;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  GLContext context;
  int *piVar5;
  
  context_00 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar1 = (*context_00->_vptr_RenderContext[4])();
  piVar5 = (int *)CONCAT44(extraout_var,iVar1);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar2 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar2);
  iVar1 = *piVar5;
  width = this->m_viewportWidth;
  if (iVar1 < this->m_viewportWidth) {
    width = iVar1;
  }
  height = this->m_viewportHeight;
  if (piVar5[1] < this->m_viewportHeight) {
    height = piVar5[1];
  }
  CVar3 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar1 - width);
  CVar4 = de::Random::getInt(&rnd,0,piVar5[1] - height);
  tcu::Surface::Surface(&reference);
  tcu::Surface::Surface(&result);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  buffers.m_colorbuffer.m_format.order = CVar3;
  buffers.m_colorbuffer.m_format.type = CVar4;
  buffers.m_colorbuffer.m_size.m_data[0] = width;
  buffers.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext(&context,context_00,log,1,(IVec4 *)&buffers);
  this_00 = &this->super_ContextWrapper;
  sglr::ContextWrapper::setContext(this_00,&context.super_Context);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  dVar2 = sglr::ContextWrapper::glGetError(this_00);
  if (dVar2 == 0) {
    sglr::ContextWrapper::setContext(this_00,(Context *)0x0);
    sglr::GLContext::~GLContext(&context);
    context.super_Context._12_4_ = (uint)(piVar5[5] != 0) << 3;
    context.super_Context._vptr_Context = (_func_int **)0x800000008;
    context.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
    sglr::ReferenceContextBuffers::ReferenceContextBuffers
              (&buffers,(PixelFormat *)&context,piVar5[6],piVar5[7],width,height,1);
    sglr::ReferenceContextLimits::ReferenceContextLimits
              ((ReferenceContextLimits *)&local_62b0,context_00);
    sglr::ReferenceContextBuffers::getColorbuffer(&local_6208,&buffers);
    sglr::ReferenceContextBuffers::getDepthbuffer(&local_6230,&buffers);
    sglr::ReferenceContextBuffers::getStencilbuffer(&local_6258,&buffers);
    sglr::ReferenceContext::ReferenceContext
              ((ReferenceContext *)&context,(ReferenceContextLimits *)&local_62b0,&local_6208,
               &local_6230,&local_6258);
    sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)&local_62b0);
    sglr::ContextWrapper::setContext(this_00,&context.super_Context);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    sglr::ContextWrapper::setContext(this_00,(Context *)0x0);
    sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&context);
    sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                      (this,&reference,&result);
    description = "Image comparison failed";
    if ((byte)iVar1 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar1 ^ 1),description);
    tcu::Surface::~Surface(&result);
    tcu::Surface::~Surface(&reference);
    return STOP;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x38);
  local_62b0 = glu::getErrorName;
  local_62a8 = dVar2;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&buffers,&local_62b0);
  glu::Error::Error(this_01,dVar2,
                    (char *)CONCAT44(buffers.m_colorbuffer.m_format.type,
                                     buffers.m_colorbuffer.m_format.order),(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestCase.cpp"
                    ,0x5a);
  __cxa_throw(this_01,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

FboTestCase::IterateResult FboTestCase::iterate (void)
{
	glu::RenderContext&			renderCtx		= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget	= renderCtx.getRenderTarget();
	TestLog&					log				= m_testCtx.getLog();

	// Viewport.
	de::Random					rnd				(deStringHash(getName()));
	int							width			= deMin32(renderTarget.getWidth(),	m_viewportWidth);
	int							height			= deMin32(renderTarget.getHeight(),	m_viewportHeight);
	int							x				= rnd.getInt(0, renderTarget.getWidth()		- width);
	int							y				= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Surface format and storage is choosen by render().
	tcu::Surface				reference;
	tcu::Surface				result;

	// Call preCheck() that can throw exception if some requirement is not met.
	preCheck();

	// Render using GLES3.
	try
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
		setContext(&context);
		render(result);

		// Check error.
		deUint32 err = glGetError();
		if (err != GL_NO_ERROR)
			throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), DE_NULL, __FILE__, __LINE__);

		setContext(DE_NULL);
	}
	catch (const FboTestUtil::FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw;
	}

	// Render reference.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		setContext(&context);
		render(reference);
		setContext(DE_NULL);
	}

	bool isOk = compare(reference, result);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}